

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O2

void Abc_NtkCycleInitStateSop(Abc_Ntk_t *pNtk,int nFrames,int fVerbose)

{
  void **ppvVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar4;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar5;
  Vec_Ptr_t *p;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar6;
  long *plVar7;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar8;
  int iVar9;
  int iVar10;
  
  if ((pNtk->ntkFunc == ABC_FUNC_SOP) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    srand(0x12341234);
    for (iVar9 = 0; iVar9 < pNtk->vPis->nSize; iVar9 = iVar9 + 1) {
      pAVar3 = Abc_NtkPi(pNtk,iVar9);
      uVar2 = rand();
      aVar4._0_4_ = uVar2 & 1;
      aVar4._4_4_ = 0;
      pAVar3->field_6 = aVar4;
    }
    for (iVar9 = 0; iVar9 < pNtk->vBoxes->nSize; iVar9 = iVar9 + 1) {
      pAVar3 = Abc_NtkBox(pNtk,iVar9);
      if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) {
        aVar5._0_4_ = Abc_LatchIsInit1(pAVar3);
        aVar5._4_4_ = 0;
        pAVar3->field_6 = aVar5;
      }
    }
    iVar9 = 0;
    p = Abc_NtkDfs(pNtk,0);
    if (nFrames < 1) {
      nFrames = iVar9;
    }
    for (; iVar9 != nFrames; iVar9 = iVar9 + 1) {
      for (iVar10 = 0; iVar10 < p->nSize; iVar10 = iVar10 + 1) {
        pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar10);
        aVar6._0_4_ = Abc_ObjSopSimulate(pAVar3);
        aVar6._4_4_ = 0;
        pAVar3->field_6 = aVar6;
      }
      for (iVar10 = 0; iVar10 < pNtk->vCos->nSize; iVar10 = iVar10 + 1) {
        plVar7 = (long *)Vec_PtrEntry(pNtk->vCos,iVar10);
        plVar7[8] = *(long *)(*(long *)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                                       (long)*(int *)plVar7[4] * 8) + 0x40);
      }
      for (iVar10 = 0; iVar10 < pNtk->vPis->nSize; iVar10 = iVar10 + 1) {
        pAVar3 = Abc_NtkPi(pNtk,iVar10);
        uVar2 = rand();
        aVar8._0_4_ = uVar2 & 1;
        aVar8._4_4_ = 0;
        pAVar3->field_6 = aVar8;
      }
      for (iVar10 = 0; iVar10 < pNtk->vBoxes->nSize; iVar10 = iVar10 + 1) {
        pAVar3 = Abc_NtkBox(pNtk,iVar10);
        if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) {
          ppvVar1 = pAVar3->pNtk->vObjs->pArray;
          *(undefined8 *)((long)ppvVar1[*(pAVar3->vFanouts).pArray] + 0x40) =
               *(undefined8 *)((long)ppvVar1[*(pAVar3->vFanins).pArray] + 0x40);
        }
      }
    }
    Vec_PtrFree(p);
    for (iVar9 = 0; iVar9 < pNtk->vBoxes->nSize; iVar9 = iVar9 + 1) {
      pAVar3 = Abc_NtkBox(pNtk,iVar9);
      if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) {
        (pAVar3->field_5).pData =
             (void *)(2 - (ulong)(*(long *)((long)pAVar3->pNtk->vObjs->pArray
                                                  [*(pAVar3->vFanouts).pArray] + 0x40) == 0));
      }
    }
    return;
  }
  __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/ret/retInit.c"
                ,0x13f,"void Abc_NtkCycleInitStateSop(Abc_Ntk_t *, int, int)");
}

Assistant:

void Abc_NtkCycleInitStateSop( Abc_Ntk_t * pNtk, int nFrames, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i, f;
    assert( Abc_NtkIsSopLogic(pNtk) );
    srand( 0x12341234 );
    // initialize the values
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)(rand() & 1);
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)Abc_LatchIsInit1(pObj);
    // simulate for the given number of timeframes
    vNodes = Abc_NtkDfs( pNtk, 0 );
    for ( f = 0; f < nFrames; f++ )
    {
        // simulate internal nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
            pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)Abc_ObjSopSimulate( pObj );
        // bring the results to the COs
        Abc_NtkForEachCo( pNtk, pObj, i )
            pObj->pCopy = Abc_ObjFanin0(pObj)->pCopy;
        // assign PI values
        Abc_NtkForEachPi( pNtk, pObj, i )
            pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)(rand() & 1);
        // transfer the latch values
        Abc_NtkForEachLatch( pNtk, pObj, i )
            Abc_ObjFanout0(pObj)->pCopy = Abc_ObjFanin0(pObj)->pCopy;
    }
    Vec_PtrFree( vNodes );
    // set the final values
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->pData = (void *)(ABC_PTRUINT_T)(Abc_ObjFanout0(pObj)->pCopy ? ABC_INIT_ONE : ABC_INIT_ZERO);
}